

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

size_t qHash(QMakeBaseKey *key)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = qHash(&key->root,0);
  sVar2 = qHash(&key->stash,0);
  return sVar2 ^ sVar1 ^ (ulong)key->hostBuild;
}

Assistant:

size_t qHash(const QMakeBaseKey &key)
{
    return qHash(key.root) ^ qHash(key.stash) ^ (uint)key.hostBuild;
}